

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

bool __thiscall capnp::Type::operator==(Type *this,Type *other)

{
  Which WVar1;
  
  WVar1 = this->baseType;
  if ((WVar1 == other->baseType) && (this->listDepth == other->listDepth)) {
    if (WVar1 < LIST) {
      return true;
    }
    if (WVar1 - 0xf < 3) {
      return (this->field_4).schema == (other->field_4).schema;
    }
    if (WVar1 != ANY_POINTER) {
      kj::_::unreachable();
    }
    if (((this->field_4).schema == (other->field_4).schema) &&
       (this->isImplicitParam == other->isImplicitParam)) {
      return (this->field_3).paramIndex == (other->field_3).paramIndex;
    }
  }
  return false;
}

Assistant:

bool Type::operator==(const Type& other) const {
  if (baseType != other.baseType || listDepth != other.listDepth) {
    return false;
  }

  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return true;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      return schema == other.schema;

    case schema::Type::LIST:
      KJ_UNREACHABLE;

    case schema::Type::ANY_POINTER:
      return scopeId == other.scopeId && isImplicitParam == other.isImplicitParam &&
          // Trying to comply with strict aliasing rules. Hopefully the compiler realizes that
          // both branches compile to the same instructions and can optimize it away.
          (scopeId != 0 || isImplicitParam ? paramIndex == other.paramIndex
                                           : anyPointerKind == other.anyPointerKind);
  }

  KJ_UNREACHABLE;
}